

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_write_format_zip_empty_zip64.c
# Opt level: O2

void test_write_format_zip_empty_zip64(void)

{
  int iVar1;
  wchar_t wVar2;
  archive *paVar3;
  archive_entry *ae;
  size_t used;
  char buff [256];
  
  paVar3 = archive_write_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_zip_empty_zip64.c"
                   ,L'(',(uint)(paVar3 != (archive *)0x0),"(a = archive_write_new()) != NULL",
                   (void *)0x0);
  iVar1 = archive_write_set_format_zip(paVar3);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_zip_empty_zip64.c"
                      ,L')',0,"ARCHIVE_OK",(long)iVar1,"archive_write_set_format_zip(a)",paVar3);
  iVar1 = archive_write_add_filter_none(paVar3);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_zip_empty_zip64.c"
                      ,L'*',0,"ARCHIVE_OK",(long)iVar1,"archive_write_add_filter_none(a)",paVar3);
  iVar1 = archive_write_set_bytes_per_block(paVar3,1);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_zip_empty_zip64.c"
                      ,L'+',0,"ARCHIVE_OK",(long)iVar1,"archive_write_set_bytes_per_block(a, 1)",
                      paVar3);
  iVar1 = archive_write_set_bytes_in_last_block(paVar3,1);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_zip_empty_zip64.c"
                      ,L',',0,"ARCHIVE_OK",(long)iVar1,"archive_write_set_bytes_in_last_block(a, 1)"
                      ,paVar3);
  iVar1 = archive_write_set_format_option(paVar3,"zip","zip64","1");
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_zip_empty_zip64.c"
                      ,L'.',0,"ARCHIVE_OK",(long)iVar1,
                      "archive_write_set_format_option(a, \"zip\", \"zip64\", \"1\")",paVar3);
  iVar1 = archive_write_open_memory(paVar3,buff,0x100,&used);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_zip_empty_zip64.c"
                      ,L'/',0,"ARCHIVE_OK",(long)iVar1,
                      "archive_write_open_memory(a, buff, sizeof(buff), &used)",paVar3);
  iVar1 = archive_write_close(paVar3);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_zip_empty_zip64.c"
                      ,L'2',0,"ARCHIVE_OK",(long)iVar1,"archive_write_close(a)",paVar3);
  iVar1 = archive_write_free(paVar3);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_zip_empty_zip64.c"
                      ,L'3',0,"ARCHIVE_OK",(long)iVar1,"archive_write_free(a)",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_zip_empty_zip64.c"
                      ,L'6',used,"used",0x62,"98",(void *)0x0);
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_zip_empty_zip64.c"
                      ,L'P',buff,"buff","PK\x06\x06,",
                      "\"PK\\006\\006\" \"\\x2c\\0\\0\\0\\0\\0\\0\\0\" \"\\x2d\\0\" \"\\x2d\\0\" \"\\0\\0\\0\\0\" \"\\0\\0\\0\\0\" \"\\0\\0\\0\\0\\0\\0\\0\\0\" \"\\0\\0\\0\\0\\0\\0\\0\\0\" \"\\0\\0\\0\\0\\0\\0\\0\\0\" \"\\0\\0\\0\\0\\0\\0\\0\\0\" \"PK\\006\\007\" \"\\0\\0\\0\\0\" \"\\0\\0\\0\\0\\0\\0\\0\\0\" \"\\1\\0\\0\\0\" \"PK\\005\\006\" \"\\0\\0\" \"\\0\\0\" \"\\0\\0\" \"\\0\\0\" \"\\0\\0\\0\\0\" \"\\0\\0\\0\\0\" \"\\0\\0\""
                      ,0x62,"98",(void *)0x0);
  paVar3 = archive_read_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_zip_empty_zip64.c"
                   ,L'U',(uint)(paVar3 != (archive *)0x0),"(a = archive_read_new()) != NULL",
                   (void *)0x0);
  wVar2 = archive_read_support_format_zip(paVar3);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_zip_empty_zip64.c"
                      ,L'V',0,"ARCHIVE_OK",(long)wVar2,"archive_read_support_format_zip(a)",paVar3);
  iVar1 = archive_read_open_memory(paVar3,buff,0x62);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_zip_empty_zip64.c"
                      ,L'W',0,"ARCHIVE_OK",(long)iVar1,"archive_read_open_memory(a, buff, 98)",
                      paVar3);
  iVar1 = archive_read_next_header(paVar3,&ae);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_zip_empty_zip64.c"
                      ,L'X',1,"ARCHIVE_EOF",(long)iVar1,"archive_read_next_header(a, &ae)",paVar3);
  iVar1 = archive_write_free(paVar3);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_zip_empty_zip64.c"
                      ,L'Y',0,"ARCHIVE_OK",(long)iVar1,"archive_write_free(a)",(void *)0x0);
  paVar3 = archive_read_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_zip_empty_zip64.c"
                   ,L'[',(uint)(paVar3 != (archive *)0x0),"(a = archive_read_new()) != NULL",
                   (void *)0x0);
  wVar2 = archive_read_support_format_zip(paVar3);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_zip_empty_zip64.c"
                      ,L'\\',0,"ARCHIVE_OK",(long)wVar2,"archive_read_support_format_zip(a)",paVar3)
  ;
  iVar1 = read_open_memory(paVar3,buff,0x62,1);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_zip_empty_zip64.c"
                      ,L']',0,"ARCHIVE_OK",(long)iVar1,"read_open_memory(a, buff, 98, 1)",paVar3);
  iVar1 = archive_read_next_header(paVar3,&ae);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_zip_empty_zip64.c"
                      ,L'^',1,"ARCHIVE_EOF",(long)iVar1,"archive_read_next_header(a, &ae)",paVar3);
  iVar1 = archive_write_free(paVar3);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_zip_empty_zip64.c"
                      ,L'_',0,"ARCHIVE_OK",(long)iVar1,"archive_write_free(a)",(void *)0x0);
  paVar3 = archive_read_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_zip_empty_zip64.c"
                   ,L'a',(uint)(paVar3 != (archive *)0x0),"(a = archive_read_new()) != NULL",
                   (void *)0x0);
  wVar2 = archive_read_support_format_zip(paVar3);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_zip_empty_zip64.c"
                      ,L'b',0,"ARCHIVE_OK",(long)wVar2,"archive_read_support_format_zip(a)",paVar3);
  iVar1 = read_open_memory_seek(paVar3,buff,0x62,0x62);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_zip_empty_zip64.c"
                      ,L'c',0,"ARCHIVE_OK",(long)iVar1,"read_open_memory_seek(a, buff, 98, 98)",
                      paVar3);
  iVar1 = archive_read_next_header(paVar3,&ae);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_zip_empty_zip64.c"
                      ,L'd',1,"ARCHIVE_EOF",(long)iVar1,"archive_read_next_header(a, &ae)",paVar3);
  iVar1 = archive_write_free(paVar3);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_zip_empty_zip64.c"
                      ,L'e',0,"ARCHIVE_OK",(long)iVar1,"archive_write_free(a)",(void *)0x0);
  return;
}

Assistant:

DEFINE_TEST(test_write_format_zip_empty_zip64)
{
	struct archive *a;
	struct archive_entry *ae;
	char buff[256];
	size_t used;

	/* Zip format: Create a new archive in memory. */
	assert((a = archive_write_new()) != NULL);
	assertEqualIntA(a, ARCHIVE_OK, archive_write_set_format_zip(a));
	assertEqualIntA(a, ARCHIVE_OK, archive_write_add_filter_none(a));
	assertEqualIntA(a, ARCHIVE_OK, archive_write_set_bytes_per_block(a, 1));
	assertEqualIntA(a, ARCHIVE_OK, archive_write_set_bytes_in_last_block(a, 1));
	/* Force zip writer to use Zip64 extensions. */
	assertEqualIntA(a, ARCHIVE_OK, archive_write_set_format_option(a, "zip", "zip64", "1"));
	assertEqualIntA(a, ARCHIVE_OK, archive_write_open_memory(a, buff, sizeof(buff), &used));

	/* Close out the archive without writing anything. */
	assertEqualIntA(a, ARCHIVE_OK, archive_write_close(a));
	assertEqualInt(ARCHIVE_OK, archive_write_free(a));

	/* Verify the correct format for an empty Zip archive with Zip64 extensions forced. */
	assertEqualInt(used, 98);
	assertEqualMem(buff,
	    "PK\006\006" /* Zip64 end-of-central-directory record */
	    "\x2c\0\0\0\0\0\0\0"  /* 44 bytes long */
	    "\x2d\0" /* Created by Zip 4.5 */
	    "\x2d\0" /* Extract with Zip 4.5 or later */
	    "\0\0\0\0" /* This is disk #0 */
	    "\0\0\0\0" /* Central dir starts on disk #0 */
	    "\0\0\0\0\0\0\0\0" /* There are 0 entries on this disk ... */
	    "\0\0\0\0\0\0\0\0" /* ... out of 0 entries total ... */
	    "\0\0\0\0\0\0\0\0" /* ... requiring a total of 0 bytes. */
	    "\0\0\0\0\0\0\0\0" /* Directory starts at offset 0 */

	    "PK\006\007" /* Zip64 end-of-central-directory locator */
	    "\0\0\0\0" /* Zip64 EOCD record is on disk #0 .. */
	    "\0\0\0\0\0\0\0\0" /* .. at offset 0 .. */
	    "\1\0\0\0"  /* .. of 1 total disks. */

	    "PK\005\006" /* Regular Zip end-of-central-directory record */
	    "\0\0" /* This is disk #0 */
	    "\0\0" /* Central dir is on disk #0 */
	    "\0\0" /* There are 0 entries on this disk ... */
	    "\0\0" /* ... out of 0 total entries ... */
	    "\0\0\0\0" /* ... requiring a total of 0 bytes. */
	    "\0\0\0\0" /* Directory starts at offset 0. */
	    "\0\0" /* File comment is zero bytes long. */,
	    98);

	/* Verify that we read this kind of empty archive correctly. */
	/* Try with the standard memory reader, and with the test
	   memory reader with and without seek support. */
	assert((a = archive_read_new()) != NULL);
	assertEqualIntA(a, ARCHIVE_OK, archive_read_support_format_zip(a));
	assertEqualIntA(a, ARCHIVE_OK, archive_read_open_memory(a, buff, 98));
	assertEqualIntA(a, ARCHIVE_EOF, archive_read_next_header(a, &ae));
	assertEqualInt(ARCHIVE_OK, archive_write_free(a));

	assert((a = archive_read_new()) != NULL);
	assertEqualIntA(a, ARCHIVE_OK, archive_read_support_format_zip(a));
	assertEqualIntA(a, ARCHIVE_OK, read_open_memory(a, buff, 98, 1));
	assertEqualIntA(a, ARCHIVE_EOF, archive_read_next_header(a, &ae));
	assertEqualInt(ARCHIVE_OK, archive_write_free(a));

	assert((a = archive_read_new()) != NULL);
	assertEqualIntA(a, ARCHIVE_OK, archive_read_support_format_zip(a));
	assertEqualIntA(a, ARCHIVE_OK, read_open_memory_seek(a, buff, 98, 98));
	assertEqualIntA(a, ARCHIVE_EOF, archive_read_next_header(a, &ae));
	assertEqualInt(ARCHIVE_OK, archive_write_free(a));
}